

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O0

void __thiscall
CoinSelection_SelectCoins_empty_target_value_map_but_calculate_fee_Test::TestBody
          (CoinSelection_SelectCoins_empty_target_value_map_but_calculate_fee_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  char *pcVar3;
  size_type sVar4;
  size_type sVar5;
  size_type sVar6;
  mapped_type_conflict *pmVar7;
  char *in_R9;
  Amount AVar8;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> ret;
  CoinSelectionOption option;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  map_searched_bnb;
  UtxoFilter *in_stack_00000340;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_00000348;
  Amount tx_fee;
  Amount fee;
  AmountMap map_select_value;
  AmountMap map_target_amount;
  ConfidentialAssetId *in_stack_fffffffffffffc18;
  CoinSelectionOption *in_stack_fffffffffffffc20;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_fffffffffffffc28;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_fffffffffffffc30;
  char *in_stack_fffffffffffffc38;
  undefined7 in_stack_fffffffffffffc58;
  undefined1 in_stack_fffffffffffffc5f;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  *in_stack_fffffffffffffc60;
  string local_338;
  AssertHelper local_318;
  Message local_310;
  string local_308;
  byte local_2e1;
  AssertionResult local_2e0;
  AssertHelper local_2d0;
  Message local_2c8;
  undefined4 local_2bc;
  size_type local_2b8;
  AssertionResult local_2b0;
  AssertHelper local_2a0;
  Message local_298;
  undefined4 local_28c;
  int64_t local_288;
  AssertionResult local_280;
  AssertHelper local_270;
  Message local_268;
  undefined8 local_260;
  string local_258;
  AssertionResult local_238;
  AssertHelper local_228;
  Message local_220;
  undefined4 local_214;
  size_type local_210;
  AssertionResult local_208;
  AssertHelper local_1f8;
  Message local_1f0;
  undefined8 local_1e8;
  AssertionResult local_1e0;
  AssertHelper local_1d0;
  Message local_1c8;
  undefined4 local_1bc;
  size_type local_1b8;
  AssertionResult local_1b0;
  AssertHelper local_1a0;
  Message local_198 [8];
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> local_158;
  char local_140 [104];
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> local_d8 [2];
  _func_int **local_a8;
  undefined1 local_a0;
  undefined1 local_98 [32];
  undefined1 local_78 [120];
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
         *)0x27ab3c);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
         *)0x27ab49);
  cfd::core::Amount::Amount((Amount *)local_78);
  AVar8 = cfd::core::Amount::CreateBySatoshiAmount(0x5dc);
  local_a8 = (_func_int **)AVar8.amount_;
  local_a0 = AVar8.ignore_check_;
  local_98._0_8_ = local_a8;
  local_98[8] = local_a0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
         *)0x27abbc);
  GetElementsOption();
  cfd::CoinSelectionOption::SetFeeAsset(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::vector
            ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)0x27abee);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      GetElementsUtxoList();
      in_stack_fffffffffffffc30 = local_d8;
      in_stack_fffffffffffffc28 = (vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)local_78;
      in_stack_fffffffffffffc20 = (CoinSelectionOption *)(local_78 + 0x10);
      in_stack_fffffffffffffc18 = (ConfidentialAssetId *)local_98;
      in_stack_fffffffffffffc38 = (char *)0x0;
      in_R9 = local_140;
      cfd::CoinSelection::SelectCoins
                ((CoinSelection *)tx_fee._8_8_,(AmountMap *)tx_fee.amount_,in_stack_00000348,
                 in_stack_00000340,
                 (CoinSelectionOption *)
                 map_searched_bnb._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (Amount *)fee.amount_,(AmountMap *)fee._8_8_,
                 (Amount *)map_select_value._M_t._M_impl._0_8_,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                  *)map_select_value._M_t._M_impl.super__Rb_tree_header._M_header._0_8_,
                 (AmountMap *)
                 map_select_value._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::operator=
                (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector(in_stack_fffffffffffffc30);
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector(in_stack_fffffffffffffc30);
    }
  }
  else {
    testing::Message::Message(local_198);
    testing::internal::AssertHelper::AssertHelper
              (&local_1a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x5a6,
               "Expected: ret = exp_selection.SelectCoins( map_target_amount, GetElementsUtxoList(), exp_filter, option, tx_fee, &map_select_value, &fee, &map_searched_bnb) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_1a0,local_198);
    testing::internal::AssertHelper::~AssertHelper(&local_1a0);
    testing::Message::~Message((Message *)0x27ae08);
  }
  local_1b8 = std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::size(&local_158);
  local_1bc = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            (in_stack_fffffffffffffc38,(char *)in_stack_fffffffffffffc30,
             (unsigned_long *)in_stack_fffffffffffffc28,(int *)in_stack_fffffffffffffc20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1b0);
  if (!bVar1) {
    testing::Message::Message(&local_1c8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x27aefd);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x5a8,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1d0,&local_1c8);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    testing::Message::~Message((Message *)0x27af60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x27afb8);
  sVar4 = std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::size(&local_158);
  if (sVar4 == 1) {
    std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::operator[](&local_158,0);
    local_1e8 = 0x2540be4;
    testing::internal::EqHelper<false>::Compare<unsigned_long,long>
              (in_stack_fffffffffffffc38,(char *)in_stack_fffffffffffffc30,
               (unsigned_long *)in_stack_fffffffffffffc28,(long *)in_stack_fffffffffffffc20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1e0);
    if (!bVar1) {
      testing::Message::Message(&local_1f0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x27b087);
      testing::internal::AssertHelper::AssertHelper
                (&local_1f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
                 ,0x5aa,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1f8,&local_1f0);
      testing::internal::AssertHelper::~AssertHelper(&local_1f8);
      testing::Message::~Message((Message *)0x27b0ea);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x27b13f);
  }
  local_210 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
              ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                      *)0x27b160);
  local_214 = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            (in_stack_fffffffffffffc38,(char *)in_stack_fffffffffffffc30,
             (unsigned_long *)in_stack_fffffffffffffc28,(int *)in_stack_fffffffffffffc20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_208);
  if (!bVar1) {
    testing::Message::Message(&local_220);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x27b1fd);
    testing::internal::AssertHelper::AssertHelper
              (&local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x5ac,pcVar3);
    testing::internal::AssertHelper::operator=(&local_228,&local_220);
    testing::internal::AssertHelper::~AssertHelper(&local_228);
    testing::Message::~Message((Message *)0x27b25a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x27b2b2);
  sVar5 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
          ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                  *)0x27b2bf);
  if (sVar5 == 1) {
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_258,&exp_dummy_asset_a);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
    ::operator[](in_stack_fffffffffffffc60,
                 (key_type *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58));
    local_260 = 0x2540be4;
    testing::internal::EqHelper<false>::Compare<long,long>
              (in_stack_fffffffffffffc38,(char *)in_stack_fffffffffffffc30,
               (long *)in_stack_fffffffffffffc28,(long *)in_stack_fffffffffffffc20);
    std::__cxx11::string::~string((string *)&local_258);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_238);
    if (!bVar1) {
      testing::Message::Message(&local_268);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x27b3cd);
      testing::internal::AssertHelper::AssertHelper
                (&local_270,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
                 ,0x5ae,pcVar3);
      testing::internal::AssertHelper::operator=(&local_270,&local_268);
      testing::internal::AssertHelper::~AssertHelper(&local_270);
      testing::Message::~Message((Message *)0x27b42a);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x27b47f);
  }
  local_288 = cfd::core::Amount::GetSatoshiValue((Amount *)local_78);
  local_28c = 0x708;
  testing::internal::EqHelper<false>::Compare<long,int>
            (in_stack_fffffffffffffc38,(char *)in_stack_fffffffffffffc30,
             (long *)in_stack_fffffffffffffc28,(int *)in_stack_fffffffffffffc20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_280);
  if (!bVar1) {
    testing::Message::Message(&local_298);
    in_stack_fffffffffffffc60 =
         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
          *)testing::AssertionResult::failure_message((AssertionResult *)0x27b543);
    testing::internal::AssertHelper::AssertHelper
              (&local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x5b0,(char *)in_stack_fffffffffffffc60);
    testing::internal::AssertHelper::operator=(&local_2a0,&local_298);
    testing::internal::AssertHelper::~AssertHelper(&local_2a0);
    testing::Message::~Message((Message *)0x27b5a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x27b5f5);
  local_2b8 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
              ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                      *)0x27b602);
  local_2bc = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            (in_stack_fffffffffffffc38,(char *)in_stack_fffffffffffffc30,
             (unsigned_long *)in_stack_fffffffffffffc28,(int *)in_stack_fffffffffffffc20);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(&local_2b0);
  if (!(bool)uVar2) {
    testing::Message::Message(&local_2c8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x27b6ab);
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
               ,0x5b1,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2d0,&local_2c8);
    testing::internal::AssertHelper::~AssertHelper(&local_2d0);
    testing::Message::~Message((Message *)0x27b708);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x27b760);
  sVar6 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                  *)0x27b76d);
  if (sVar6 == 1) {
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_308,&exp_dummy_asset_a);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                           *)in_stack_fffffffffffffc60,
                          (key_type *)CONCAT17(uVar2,in_stack_fffffffffffffc58));
    local_2e1 = ~*pmVar7 & 1;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffc20,(bool *)in_stack_fffffffffffffc18,
               (type *)0x27b7d4);
    std::__cxx11::string::~string((string *)&local_308);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2e0);
    if (!bVar1) {
      testing::Message::Message(&local_310);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_338,(internal *)&local_2e0,
                 (AssertionResult *)"map_searched_bnb[exp_dummy_asset_a.GetHex()]","true","false",
                 in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_318,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_coin_selection.cpp"
                 ,0x5b3,pcVar3);
      testing::internal::AssertHelper::operator=(&local_318,&local_310);
      testing::internal::AssertHelper::~AssertHelper(&local_318);
      std::__cxx11::string::~string((string *)&local_338);
      testing::Message::~Message((Message *)0x27b8ff);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x27b977);
  }
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector(in_stack_fffffffffffffc30);
  cfd::CoinSelectionOption::~CoinSelectionOption((CoinSelectionOption *)0x27b9a2);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          *)0x27b9af);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
          *)0x27b9bc);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
          *)0x27b9c9);
  return;
}

Assistant:

TEST(CoinSelection, SelectCoins_empty_target_value_map_but_calculate_fee) {
  AmountMap map_target_amount;
  AmountMap map_select_value;
  Amount fee;
  Amount tx_fee = Amount::CreateBySatoshiAmount(1500);
  std::map<std::string, bool> map_searched_bnb;
  CoinSelectionOption option = GetElementsOption();
  option.SetFeeAsset(exp_dummy_asset_a);
  std::vector<Utxo> ret;
  EXPECT_NO_THROW(ret = exp_selection.SelectCoins(
      map_target_amount, GetElementsUtxoList(), exp_filter, option,
      tx_fee, &map_select_value, &fee, &map_searched_bnb));

  EXPECT_EQ(ret.size(), 1);
  if (ret.size() == 1) {
    EXPECT_EQ(ret[0].amount, static_cast<int64_t>(39062500));
  }
  EXPECT_EQ(map_select_value.size(), 1);
  if (map_select_value.size() == 1) {
    EXPECT_EQ(map_select_value[exp_dummy_asset_a.GetHex()], static_cast<int64_t>(39062500));
  }
  EXPECT_EQ(fee.GetSatoshiValue(), 1800);
  EXPECT_EQ(map_searched_bnb.size(), 1);
  if (map_searched_bnb.size() == 1) {
    EXPECT_FALSE(map_searched_bnb[exp_dummy_asset_a.GetHex()]);
  }
}